

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  OfType OVar1;
  pointer pMVar2;
  pointer pMVar3;
  pointer pcVar4;
  string *psVar5;
  int iVar6;
  XmlWriter *pXVar7;
  XmlWriter *pXVar8;
  XmlWriter *pXVar9;
  string *text;
  ScopedElement scoped_2;
  ScopedElement scoped;
  ScopedElement scoped_5;
  undefined1 local_140 [32];
  size_t local_120;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  size_t local_d8;
  string local_d0;
  undefined1 local_b0 [32];
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  char local_60 [16];
  string local_50;
  
  if ((assertionStats->assertionResult).m_resultData.resultType != Ok) {
    pMVar2 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar3 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar2 != pMVar3) {
      pXVar7 = (XmlWriter *)(local_140 + 0x10);
      pXVar9 = &this->m_xml;
      text = &pMVar2->message;
      do {
        iVar6 = *(int *)((long)&text[-1].field_2 + 8);
        if (iVar6 == 2) {
          local_140._0_8_ = pXVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Warning","");
          local_f8._0_8_ = pXVar9;
          XmlWriter::startElement(pXVar9,(string *)local_140);
          XmlWriter::writeText((XmlWriter *)local_f8._0_8_,text,true);
LAB_00144cef:
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_f8);
          if ((XmlWriter *)local_140._0_8_ != pXVar7) {
            operator_delete((void *)local_140._0_8_);
          }
        }
        else if (iVar6 == 1) {
          local_140._0_8_ = pXVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Info","");
          local_f8._0_8_ = pXVar9;
          XmlWriter::startElement(pXVar9,(string *)local_140);
          XmlWriter::writeText((XmlWriter *)local_f8._0_8_,text,true);
          goto LAB_00144cef;
        }
        psVar5 = text + 1;
        text = (string *)((long)&text[3].field_2 + 8);
      } while ((pointer)&psVar5->_M_string_length != pMVar3);
    }
  }
  iVar6 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[7])();
  if (((char)iVar6 == '\0') &&
     (((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok)) {
    return true;
  }
  if ((assertionStats->assertionResult).m_info.capturedExpression._M_string_length != 0) {
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Expression","");
    pXVar9 = &this->m_xml;
    pXVar7 = XmlWriter::startElement(pXVar9,(string *)local_118);
    local_70._M_allocated_capacity = (size_type)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"success","");
    pXVar7 = XmlWriter::writeAttribute
                       (pXVar7,(string *)&local_70,
                        ((assertionStats->assertionResult).m_resultData.resultType & FailureBit) ==
                        Ok);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"type","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pcVar4 = (assertionStats->assertionResult).m_info.macroName._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar4,
               pcVar4 + (assertionStats->assertionResult).m_info.macroName._M_string_length);
    pXVar7 = XmlWriter::writeAttribute(pXVar7,&local_d0,&local_90);
    local_b0._0_8_ = (XmlWriter *)(local_b0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"filename","");
    local_140._0_8_ = local_140 + 0x10;
    pcVar4 = (assertionStats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_140,pcVar4,
               pcVar4 + (assertionStats->assertionResult).m_info.lineInfo.file._M_string_length);
    local_120 = (assertionStats->assertionResult).m_info.lineInfo.line;
    pXVar8 = XmlWriter::writeAttribute(pXVar7,(string *)local_b0,(string *)local_140);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"line","");
    pXVar7 = (XmlWriter *)(local_f8 + 0x10);
    pcVar4 = (assertionStats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
    local_f8._0_8_ = pXVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f8,pcVar4,
               pcVar4 + (assertionStats->assertionResult).m_info.lineInfo.file._M_string_length);
    local_d8 = (assertionStats->assertionResult).m_info.lineInfo.line;
    XmlWriter::writeAttribute<unsigned_long>(pXVar8,&local_50,&local_d8);
    pXVar8 = (XmlWriter *)(local_140 + 0x10);
    if ((XmlWriter *)local_f8._0_8_ != pXVar7) {
      operator_delete((void *)local_f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((XmlWriter *)local_140._0_8_ != pXVar8) {
      operator_delete((void *)local_140._0_8_);
    }
    if ((XmlWriter *)local_b0._0_8_ != (XmlWriter *)(local_b0 + 0x10)) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((char *)local_70._M_allocated_capacity != local_60) {
      operator_delete((void *)local_70._M_allocated_capacity);
    }
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
    local_140._0_8_ = pXVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Original","");
    local_118._0_8_ = pXVar9;
    XmlWriter::startElement(pXVar9,(string *)local_140);
    AssertionResult::getExpression_abi_cxx11_((string *)local_f8,&assertionStats->assertionResult);
    XmlWriter::writeText((XmlWriter *)local_118._0_8_,(string *)local_f8,true);
    if ((XmlWriter *)local_f8._0_8_ != pXVar7) {
      operator_delete((void *)local_f8._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_118);
    if ((XmlWriter *)local_140._0_8_ != pXVar8) {
      operator_delete((void *)local_140._0_8_);
    }
    local_140._0_8_ = pXVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Expanded","");
    local_118._0_8_ = pXVar9;
    XmlWriter::startElement(pXVar9,(string *)local_140);
    pcVar4 = (assertionStats->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p
    ;
    local_f8._0_8_ = pXVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f8,pcVar4,
               pcVar4 + (assertionStats->assertionResult).m_resultData.reconstructedExpression.
                        _M_string_length);
    XmlWriter::writeText((XmlWriter *)local_118._0_8_,(string *)local_f8,true);
    if ((XmlWriter *)local_f8._0_8_ != pXVar7) {
      operator_delete((void *)local_f8._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_118);
    if ((XmlWriter *)local_140._0_8_ != pXVar8) {
      operator_delete((void *)local_140._0_8_);
    }
  }
  OVar1 = (assertionStats->assertionResult).m_resultData.resultType;
  if (OVar1 < ThrewException) {
    if (OVar1 == Info) {
      local_140._0_8_ = local_140 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Info","");
      local_118._0_8_ = &this->m_xml;
      XmlWriter::startElement((XmlWriter *)local_118._0_8_,(string *)local_140);
      local_f8._0_8_ = local_f8 + 0x10;
      pcVar4 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar4,
                 pcVar4 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_118._0_8_,(string *)local_f8,true);
    }
    else {
      if (OVar1 != ExplicitFailure) goto LAB_0014536a;
      local_140._0_8_ = local_140 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Failure","");
      local_118._0_8_ = &this->m_xml;
      XmlWriter::startElement((XmlWriter *)local_118._0_8_,(string *)local_140);
      local_f8._0_8_ = local_f8 + 0x10;
      pcVar4 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar4,
                 pcVar4 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_118._0_8_,(string *)local_f8,true);
    }
    if ((XmlWriter *)local_f8._0_8_ != (XmlWriter *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_118);
    pXVar9 = (XmlWriter *)local_140._0_8_;
    if ((XmlWriter *)local_140._0_8_ == (XmlWriter *)(local_140 + 0x10)) goto LAB_0014536a;
  }
  else {
    if (OVar1 == FatalErrorCondition) {
      local_118._0_8_ = local_118 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"Fatal Error Condition","");
      local_b0._0_8_ = &this->m_xml;
      XmlWriter::startElement((XmlWriter *)local_b0._0_8_,(string *)local_118);
      local_70._M_allocated_capacity = (size_type)local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"filename","");
      local_140._0_8_ = local_140 + 0x10;
      pcVar4 = (assertionStats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_140,pcVar4,
                 pcVar4 + (assertionStats->assertionResult).m_info.lineInfo.file._M_string_length);
      local_120 = (assertionStats->assertionResult).m_info.lineInfo.line;
      XmlWriter::writeAttribute((XmlWriter *)local_b0._0_8_,(string *)&local_70,(string *)local_140)
      ;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"line","");
      local_f8._0_8_ = local_f8 + 0x10;
      pcVar4 = (assertionStats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar4,
                 pcVar4 + (assertionStats->assertionResult).m_info.lineInfo.file._M_string_length);
      local_d8 = (assertionStats->assertionResult).m_info.lineInfo.line;
      XmlWriter::writeAttribute<unsigned_long>((XmlWriter *)local_b0._0_8_,&local_d0,&local_d8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar4 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar4,
                 pcVar4 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_b0._0_8_,&local_90,true);
    }
    else {
      if (OVar1 != ThrewException) goto LAB_0014536a;
      local_118._0_8_ = local_118 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Exception","");
      local_b0._0_8_ = &this->m_xml;
      XmlWriter::startElement((XmlWriter *)local_b0._0_8_,(string *)local_118);
      local_70._M_allocated_capacity = (size_type)local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"filename","");
      local_140._0_8_ = local_140 + 0x10;
      pcVar4 = (assertionStats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_140,pcVar4,
                 pcVar4 + (assertionStats->assertionResult).m_info.lineInfo.file._M_string_length);
      local_120 = (assertionStats->assertionResult).m_info.lineInfo.line;
      XmlWriter::writeAttribute((XmlWriter *)local_b0._0_8_,(string *)&local_70,(string *)local_140)
      ;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"line","");
      local_f8._0_8_ = local_f8 + 0x10;
      pcVar4 = (assertionStats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar4,
                 pcVar4 + (assertionStats->assertionResult).m_info.lineInfo.file._M_string_length);
      local_d8 = (assertionStats->assertionResult).m_info.lineInfo.line;
      XmlWriter::writeAttribute<unsigned_long>((XmlWriter *)local_b0._0_8_,&local_d0,&local_d8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar4 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar4,
                 pcVar4 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_b0._0_8_,&local_90,true);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((XmlWriter *)local_f8._0_8_ != (XmlWriter *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((XmlWriter *)local_140._0_8_ != (XmlWriter *)(local_140 + 0x10)) {
      operator_delete((void *)local_140._0_8_);
    }
    if ((char *)local_70._M_allocated_capacity != local_60) {
      operator_delete((void *)local_70._M_allocated_capacity);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b0);
    pXVar9 = (XmlWriter *)local_118._0_8_;
    if ((XmlWriter *)local_118._0_8_ == (XmlWriter *)(local_118 + 0x10)) goto LAB_0014536a;
  }
  operator_delete(pXVar9);
LAB_0014536a:
  if ((assertionStats->assertionResult).m_info.capturedExpression._M_string_length != 0) {
    XmlWriter::endElement(&this->m_xml);
  }
  return true;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& assertionStats ) {
            const AssertionResult& assertionResult = assertionStats.assertionResult;

            // Print any info messages in <Info> tags.
            if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
                for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                        it != itEnd;
                        ++it ) {
                    if( it->type == ResultWas::Info ) {
                        m_xml.scopedElement( "Info" )
                            .writeText( it->message );
                    } else if ( it->type == ResultWas::Warning ) {
                        m_xml.scopedElement( "Warning" )
                            .writeText( it->message );
                    }
                }
            }

            // Drop out if result was successful but we're not printing them.
            if( !m_config->includeSuccessfulResults() && isOk(assertionResult.getResultType()) )
                return true;

            // Print the expression if there is one.
            if( assertionResult.hasExpression() ) {
                m_xml.startElement( "Expression" )
                    .writeAttribute( "success", assertionResult.succeeded() )
					.writeAttribute( "type", assertionResult.getTestMacroName() )
                    .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                    .writeAttribute( "line", assertionResult.getSourceInfo().line );

                m_xml.scopedElement( "Original" )
                    .writeText( assertionResult.getExpression() );
                m_xml.scopedElement( "Expanded" )
                    .writeText( assertionResult.getExpandedExpression() );
            }

            // And... Print a result applicable to each result type.
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    m_xml.scopedElement( "Exception" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::FatalErrorCondition:
                    m_xml.scopedElement( "Fatal Error Condition" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Info:
                    m_xml.scopedElement( "Info" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Warning:
                    // Warning will already have been written
                    break;
                case ResultWas::ExplicitFailure:
                    m_xml.scopedElement( "Failure" )
                        .writeText( assertionResult.getMessage() );
                    break;
                default:
                    break;
            }

            if( assertionResult.hasExpression() )
                m_xml.endElement();

            return true;
        }